

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v8::detail::
         write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>
                   (appender out,decimal_fp<float> *fp,basic_format_specs<char> *specs,
                   float_specs fspecs,char decimal_point)

{
  bool bVar1;
  type tVar2;
  int iVar3;
  appender it;
  float_specs in_RCX;
  int *in_RDX;
  undefined4 *in_RSI;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_RDI;
  undefined1 in_R8B;
  bool pointy;
  int num_zeros;
  int num_zeros_3;
  int num_zeros_2;
  int exp;
  anon_class_28_7_94dcc806 write;
  char exp_char;
  int exp_digits;
  int abs_output_exp;
  int num_zeros_1;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  int output_exp;
  size_t size;
  sign_t sign;
  int significand_size;
  significand_type significand;
  undefined4 in_stack_fffffffffffffe80;
  undefined3 uVar4;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  int iVar6;
  undefined4 in_stack_fffffffffffffe8c;
  undefined2 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe92;
  undefined1 in_stack_fffffffffffffe93;
  undefined1 uVar7;
  undefined4 in_stack_fffffffffffffe94;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffe98;
  anon_class_28_7_94dcc806 *in_stack_fffffffffffffec0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> in_stack_fffffffffffffec8;
  int local_12c;
  int local_a8;
  anon_class_12_2_f0c9b3c6 local_50;
  int local_44;
  ulong local_40;
  uint local_38;
  int local_34;
  undefined4 local_30;
  undefined1 local_29;
  int *local_28;
  undefined4 *local_20;
  float_specs local_18;
  appender local_10;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_8;
  uint uVar5;
  
  local_30 = *in_RSI;
  local_29 = in_R8B;
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RCX;
  local_10.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)
       (back_insert_iterator<fmt::v8::detail::buffer<char>_>)in_RDI.container;
  local_34 = get_significand_size<float>((decimal_fp<float> *)0x124b8f);
  local_38 = (uint)local_18._4_4_ >> 8 & 0xff;
  tVar2 = to_unsigned<int>(0);
  local_40 = (ulong)(tVar2 + (local_38 != 0));
  local_50.output_exp = local_20[1] + local_34 + -1;
  local_50.fspecs = local_18;
  local_44 = local_50.output_exp;
  bVar1 = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
          anon_class_12_2_f0c9b3c6::operator()(&local_50);
  if (bVar1) {
    if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
      if (local_34 == 1) {
        local_29 = 0;
      }
    }
    else {
      tVar2 = to_unsigned<int>(0);
      local_40 = tVar2 + local_40;
    }
    iVar3 = local_44;
    if (local_44 < 0) {
      iVar3 = -local_44;
    }
    tVar2 = to_unsigned<int>(0);
    local_40 = tVar2 + local_40;
    uVar7 = 0x45;
    if ((local_18._4_4_ & 0x10000) == 0) {
      uVar7 = 0x65;
    }
    if (*local_28 < 1) {
      reserve<fmt::v8::appender>(&local_10,local_40);
      it = write_float<fmt::v8::appender,_fmt::v8::detail::dragonbox::decimal_fp<float>,_char>::
           anon_class_28_7_94dcc806::operator()
                     (in_stack_fffffffffffffec0,(iterator)in_stack_fffffffffffffec8.container);
      local_8.container = (buffer<char> *)base_iterator<fmt::v8::appender>(local_10,it);
    }
    else {
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_1_&>
                     (in_stack_fffffffffffffe98.container,
                      (basic_format_specs<char> *)
                      CONCAT44(iVar3,CONCAT13(uVar7,CONCAT12(0x65,in_stack_fffffffffffffe90))),
                      CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (anon_class_28_7_94dcc806 *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
  }
  else {
    local_a8 = local_20[1] + local_34;
    if ((int)local_20[1] < 0) {
      if (local_a8 < 1) {
        local_12c = -local_a8;
        if (((local_34 == 0) && (-1 < local_18.precision)) && (local_18.precision < local_12c)) {
          local_12c = local_18.precision;
        }
        uVar4 = (undefined3)in_stack_fffffffffffffe84;
        uVar5 = CONCAT13(1,uVar4);
        if ((local_12c == 0) && (uVar5 = CONCAT13(1,uVar4), local_34 == 0)) {
          uVar5 = CONCAT13((char)((uint)local_18._4_4_ >> 0x14),uVar4) & 0x1ffffff;
        }
        iVar3 = ((char)(uVar5 >> 0x18) != '\0') + 1;
        tVar2 = to_unsigned<int>(0);
        local_40 = (iVar3 + tVar2) + local_40;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_4_>
                       ((appender)&local_38,
                        (basic_format_specs<char> *)
                        CONCAT44(in_stack_fffffffffffffe94,
                                 CONCAT13(in_stack_fffffffffffffe93,
                                          CONCAT12(in_stack_fffffffffffffe92,
                                                   in_stack_fffffffffffffe90))),
                        CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                        (anon_class_48_6_d9b5e731 *)CONCAT44(uVar5,iVar3));
      }
      else {
        if (((uint)local_18._4_4_ >> 0x14 & 1) == 0) {
          iVar3 = 0;
        }
        else {
          iVar3 = local_18.precision - local_34;
        }
        iVar6 = iVar3;
        if (iVar3 < 1) {
          iVar6 = 0;
        }
        tVar2 = to_unsigned<int>(0);
        local_40 = (tVar2 + 1) + local_40;
        local_8.container =
             (buffer<char> *)
             write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_3_>
                       (in_stack_fffffffffffffe98.container,
                        (basic_format_specs<char> *)
                        CONCAT44(in_stack_fffffffffffffe94,
                                 CONCAT13(in_stack_fffffffffffffe93,
                                          CONCAT12(in_stack_fffffffffffffe92,
                                                   in_stack_fffffffffffffe90))),
                        CONCAT44(iVar3,iVar6),
                        (anon_class_48_6_48d028d1 *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      }
    }
    else {
      tVar2 = to_unsigned<int>(0);
      local_40 = tVar2 + local_40;
      local_a8 = local_18.precision - local_a8;
      if (((uint)local_18._4_4_ >> 0x14 & 1) != 0) {
        if ((local_a8 < 1) && (local_18._4_1_ != '\x02')) {
          local_a8 = 1;
        }
        if (0 < local_a8) {
          tVar2 = to_unsigned<int>(0);
          local_40 = (tVar2 + 1) + local_40;
        }
      }
      local_8.container =
           (buffer<char> *)
           write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_float<fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>,char>(fmt::v8::appender,fmt::v8::detail::dragonbox::decimal_fp<float>const&,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::float_specs,char)::_lambda(fmt::v8::appender)_2_>
                     (in_stack_fffffffffffffe98.container,
                      (basic_format_specs<char> *)
                      CONCAT44(in_stack_fffffffffffffe94,
                               CONCAT13(in_stack_fffffffffffffe93,
                                        CONCAT12(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90
                                                ))),
                      CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                      (anon_class_56_7_a2a26a24 *)
                      CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    }
  }
  return (appender)(back_insert_iterator<fmt::v8::detail::buffer<char>_>)local_8.container;
}

Assistant:

auto write_float(OutputIt out, const DecimalFP& fp,
                 const basic_format_specs<Char>& specs, float_specs fspecs,
                 Char decimal_point) -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  static const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand<Char>(it, significand, significand_size);
      it = detail::fill_n(it, fp.exponent, zero);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = static_cast<Char>(data::signs[sign]);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}